

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCall(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                  IntrusiveList<TypeHandle> generics,SynCallArgument *argumentHead,bool allowFailure
                  )

{
  Allocator *pAVar1;
  ExprBase *pEVar2;
  ArrayView<FunctionValue> functions_00;
  SmallArray<FunctionValue,_32U> functions;
  SmallArray<FunctionValue,_32U> local_348;
  
  pAVar1 = ctx->allocator;
  memset(local_348.little,0,0x300);
  local_348.count = 0;
  local_348.max = 0x20;
  local_348.data = local_348.little;
  local_348.allocator = pAVar1;
  GetNodeFunctions(ctx,source,value,&local_348);
  functions_00.count = local_348.count;
  functions_00.data = local_348.data;
  functions_00._12_4_ = 0;
  pEVar2 = CreateFunctionCallOverloaded
                     (ctx,source,value,functions_00,generics,argumentHead,allowFailure);
  SmallArray<FunctionValue,_32U>::~SmallArray(&local_348);
  return pEVar2;
}

Assistant:

ExprBase* CreateFunctionCall(ExpressionContext &ctx, SynBase *source, ExprBase *value, IntrusiveList<TypeHandle> generics, SynCallArgument *argumentHead, bool allowFailure)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	return CreateFunctionCallOverloaded(ctx, source, value, functions, generics, argumentHead, allowFailure);
}